

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_quote(connectdata *conn,_Bool init,ftpstate instate)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  int iVar1;
  Curl_easy *data;
  void *pvVar2;
  CURLcode CVar3;
  long lVar4;
  undefined8 *puVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  
  data = conn->data;
  lVar4 = 0x9e8;
  if (instate - FTP_RETR_PREQUOTE < 3) {
    lVar4 = *(long *)(&DAT_004e1118 + (ulong)(instate - FTP_RETR_PREQUOTE) * 8);
  }
  pvVar2 = (data->req).protop;
  pp = &conn->proto;
  puVar5 = *(undefined8 **)((long)data->sockets + lVar4 + -0x80);
  if (init) {
    (conn->proto).ftpc.count1 = 0;
LAB_00452e8c:
    if (puVar5 != (undefined8 *)0x0) {
LAB_00452ec3:
      pcVar6 = (char *)*puVar5;
      bVar8 = *pcVar6 == '*';
      *(uint *)((long)&conn->proto + 0xb4) = (uint)bVar8;
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",pcVar6 + bVar8);
      if (CVar3 == CURLE_OK) {
        (conn->proto).ftpc.state = instate;
        CVar3 = CURLE_OK;
      }
      return CVar3;
    }
  }
  else {
    iVar1 = (conn->proto).ftpc.count1;
    (conn->proto).ftpc.count1 = iVar1 + 1;
    if (puVar5 != (undefined8 *)0x0) {
      if (iVar1 < 0) goto LAB_00452ec3;
      iVar7 = 0;
      do {
        puVar5 = (undefined8 *)puVar5[1];
        if (iVar1 <= iVar7) break;
        iVar7 = iVar7 + 1;
      } while (puVar5 != (undefined8 *)0x0);
      goto LAB_00452e8c;
    }
  }
  if (instate == FTP_RETR_PREQUOTE) {
    if (*(int *)((long)pvVar2 + 0x28) != 0) {
      (conn->proto).ftpc.state = FTP_STOP;
      return CURLE_OK;
    }
    lVar4 = (conn->proto).ftpc.known_filesize;
    if (lVar4 != -1) {
      Curl_pgrsSetDownloadSize(data,lVar4);
      CVar3 = ftp_state_retr(conn,(conn->proto).ftpc.known_filesize);
      return CVar3;
    }
    pcVar6 = (conn->proto).ftpc.file;
    if ((data->set).ignorecl != true) {
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"SIZE %s",pcVar6);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      (conn->proto).ftpc.state = FTP_RETR_SIZE;
      return CURLE_OK;
    }
    CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"RETR %s",pcVar6);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    (conn->proto).ftpc.state = FTP_RETR;
    return CURLE_OK;
  }
  if (instate == FTP_STOR_PREQUOTE) {
    CVar3 = ftp_state_ul_setup(conn,false);
    return CVar3;
  }
  if (instate == FTP_POSTQUOTE) {
    return CURLE_OK;
  }
  if ((conn->proto).ftpc.cwddone != true) {
    (conn->proto).ftpc.count2 = 0;
    *(uint *)((long)&conn->proto + 0xb8) = (uint)((data->set).ftp_create_missing_dirs == 2);
    if (((data->set).ftp_filemethod != FTPFILE_NOCWD) || ((conn->proto).ftpc.cwdcount != 0)) {
      if (((conn->bits).reuse == true) &&
         (pcVar6 = (conn->proto).ftpc.entrypath, pcVar6 != (char *)0x0)) {
        (conn->proto).ftpc.cwdcount = 0;
      }
      else {
        if ((conn->proto).ftpc.dirdepth == 0) goto LAB_00452f0d;
        (conn->proto).ftpc.cwdcount = 1;
        pcVar6 = *(conn->proto).ftpc.dirs;
      }
      CVar3 = Curl_pp_sendf(&(pp->ftpc).pp,"CWD %s",pcVar6);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      (conn->proto).ftpc.state = FTP_CWD;
      return CURLE_OK;
    }
  }
LAB_00452f0d:
  CVar3 = ftp_state_mdtm(conn);
  return CVar3;
}

Assistant:

static CURLcode ftp_state_quote(struct connectdata *conn,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      PPSENDF(&ftpc->pp, "%s", cmd);
      state(conn, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != FTPTRANSFER_BODY)
        state(conn, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(conn, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl) {
            /* This code is to support download of growing files.  It prevents
               the state machine from requesting the file size from the
               server.  With an unknown file size the download continues until
               the server terminates it, otherwise the client stops if the
               received byte count exceeds the reported file size.  Set option
               CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this behavior.*/
            PPSENDF(&ftpc->pp, "RETR %s", ftpc->file);
            state(conn, FTP_RETR);
          }
          else {
            PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
            state(conn, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(conn, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}